

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O3

Molecule_p __thiscall indigox::Bond::GetMolecule(Bond *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  Molecule_p MVar1;
  
  if ((*(long *)(in_RSI + 0x40) == 0) || (*(int *)(*(long *)(in_RSI + 0x40) + 8) == 0)) {
    (this->super_CountableObject<indigox::Bond>).id_ = 0;
    (this->super_enable_shared_from_this<indigox::Bond>)._M_weak_this.
    super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    std::__shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)this,in_RSI + 0x38);
    in_RDX._M_pi = extraout_RDX;
  }
  MVar1.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  MVar1.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Molecule_p)MVar1.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Molecule_p Bond::GetMolecule() const {
    if (!mol_.expired()) return mol_.lock();
    else return Molecule_p();
  }